

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O3

void cmd_ln_val_free(cmd_ln_val_t *val)

{
  undefined8 *ptr;
  void *ptr_00;
  uint uVar1;
  undefined8 *puVar2;
  
  uVar1 = val->type;
  if (((uVar1 & 0x20) != 0) && (ptr = (undefined8 *)(val->val).ptr, ptr != (undefined8 *)0x0)) {
    ptr_00 = (void *)*ptr;
    puVar2 = ptr;
    while (ptr_00 != (void *)0x0) {
      puVar2 = puVar2 + 1;
      ckd_free(ptr_00);
      ptr_00 = (void *)*puVar2;
    }
    ckd_free(ptr);
    uVar1 = val->type;
  }
  if ((uVar1 & 8) != 0) {
    ckd_free((val->val).ptr);
  }
  ckd_free(val->name);
  ckd_free(val);
  return;
}

Assistant:

void
cmd_ln_val_free(cmd_ln_val_t *val)
{
    int i;
    if (val->type & ARG_STRING_LIST) {
        char ** array = (char **)val->val.ptr;
        if (array) {
            for (i = 0; array[i] != NULL; i++) {
                ckd_free(array[i]);
            }
            ckd_free(array);
        }
    }
    if (val->type & ARG_STRING)
        ckd_free(val->val.ptr);
    ckd_free(val->name);
    ckd_free(val);
}